

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O2

void __thiscall
reflect::TypeDescriptor_Struct::dump(TypeDescriptor_Struct *this,void *obj,int indentLevel)

{
  pointer pMVar1;
  ostream *poVar2;
  Member *member;
  pointer pMVar3;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  ulong local_40;
  void *local_38;
  
  local_38 = obj;
  poVar2 = std::operator<<((ostream *)&std::cout,(this->super_TypeDescriptor).name);
  poVar2 = std::operator<<(poVar2," {");
  std::endl<char,std::char_traits<char>>(poVar2);
  pMVar1 = (this->members).
           super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (ulong)(uint)indentLevel;
  for (pMVar3 = (this->members).
                super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct((ulong)local_60,(char)indentLevel * '\x04' + '\x04');
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_60);
    poVar2 = std::operator<<(poVar2,pMVar3->name);
    std::operator<<(poVar2," = ");
    std::__cxx11::string::~string((string *)local_60);
    (*pMVar3->type->_vptr_TypeDescriptor[3])
              (pMVar3->type,pMVar3->offset + (long)local_38,(ulong)(indentLevel + 1));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct((ulong)local_60,(char)((int)local_40 << 2));
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_60);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

virtual void dump(const void* obj, int indentLevel) const override {
        std::cout << name << " {" << std::endl;
        for (const Member& member : members) {
            std::cout << std::string(4 * (indentLevel + 1), ' ') << member.name << " = ";
            member.type->dump((char*) obj + member.offset, indentLevel + 1);
            std::cout << std::endl;
        }
        std::cout << std::string(4 * indentLevel, ' ') << "}";
    }